

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAAstar.cpp
# Opt level: O0

void __thiscall GMAA_MAAstar::NewPPI(GMAA_MAAstar *this)

{
  double in_stack_00000008;
  PJPDP_sharedPtr *in_stack_00000010;
  GMAA_MAAstar *in_stack_00000018;
  
  NewPPI(in_stack_00000018,in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

PartialPolicyPoolItemInterface_sharedPtr
GMAA_MAAstar::NewPPI(const PJPDP_sharedPtr &jp,
                     double v) const
{
    //NOTE: this conversion to an index does save a lot of space, so
    //if we can enable this again would be better.
    //PartialPolicyPoolItemInterface* ppi=new JPPVIndexValPair(jp,v);
    //delete jp;
    PartialPolicyPoolItemInterface_sharedPtr ppi=
        PartialPolicyPoolItemInterface_sharedPtr(new PartialJPDPValuePair(jp,v));
    return (ppi);
}